

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O2

void ON_SortUINT64Array(sort_algorithm sort_algorithm,ON__UINT64 *a,size_t nel)

{
  ulong uVar1;
  int iVar2;
  ON__UINT64 *pOVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  ON__UINT64 OVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong uVar14;
  ON__UINT64 *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (ON__UINT64 *)0x0) {
      uVar5 = nel >> 1;
      pOVar3 = a + (nel - 1);
      uVar6 = nel - 1;
LAB_005bb9d0:
      if (uVar5 == 0) {
        OVar10 = *pOVar3;
        *pOVar3 = *a;
        uVar6 = uVar6 - 1;
        if (uVar6 == 0) {
          *a = OVar10;
          return;
        }
        pOVar3 = pOVar3 + -1;
        uVar5 = 0;
      }
      else {
        OVar10 = a[uVar5 - 1];
        uVar5 = uVar5 - 1;
      }
      puVar4 = a + uVar5;
      uVar14 = uVar5;
      do {
        uVar11 = uVar14 * 2;
        do {
          uVar14 = uVar11 + 1;
          if (uVar6 < uVar14) {
            *puVar4 = OVar10;
            goto LAB_005bb9d0;
          }
          puVar7 = a + uVar14;
          if (uVar14 < uVar6) {
            uVar11 = *puVar7;
            uVar1 = puVar7[1];
            uVar8 = uVar11;
            if (uVar11 < uVar1) {
              uVar8 = uVar1;
            }
            if (uVar11 < uVar1) {
              puVar7 = puVar7 + 1;
            }
            uVar14 = uVar14 + (uVar11 < uVar1);
          }
          else {
            uVar8 = *puVar7;
          }
          uVar11 = uVar6;
        } while (uVar8 <= OVar10);
        *puVar4 = uVar8;
        puVar4 = puVar7;
      } while( true );
    }
  }
  else if (1 < nel && a != (ON__UINT64 *)0x0) {
    uVar5 = 0;
    puVar4 = a + (nel - 1);
LAB_005bb7e8:
    while( true ) {
      iVar2 = (int)uVar5;
      uVar6 = ((long)puVar4 - (long)a >> 3) + 1;
      if (uVar6 < 9) break;
      puVar7 = (ulong *)((long)a + (uVar6 & 0xfffffffffffffffe) * 4);
      uVar6 = *a;
      uVar11 = *puVar7;
      uVar14 = uVar6;
      if (uVar11 < uVar6) {
        *a = uVar11;
        *puVar7 = uVar6;
        uVar14 = *a;
        uVar11 = uVar6;
      }
      uVar6 = *puVar4;
      if (uVar6 < uVar14) {
        *a = uVar6;
        *puVar4 = uVar14;
        uVar11 = *puVar7;
        uVar6 = uVar14;
      }
      puVar9 = a;
      puVar12 = puVar4;
      if (uVar6 < uVar11) {
        *puVar7 = uVar6;
        *puVar4 = uVar11;
      }
LAB_005bb845:
      if (puVar9 < puVar7) {
        do {
          puVar9 = puVar9 + 1;
          if (puVar7 <= puVar9) break;
        } while (*puVar9 <= *puVar7);
      }
      if (puVar7 <= puVar9) {
        do {
          puVar9 = puVar9 + 1;
          if (puVar4 < puVar9) break;
        } while (*puVar9 <= *puVar7);
      }
      do {
        puVar13 = puVar12;
        puVar12 = puVar13 + -1;
        if (puVar12 <= puVar7) break;
      } while (*puVar7 < *puVar12);
      if (puVar9 <= puVar12) {
        uVar6 = *puVar9;
        *puVar9 = *puVar12;
        *puVar12 = uVar6;
        if (puVar12 == puVar7) {
          puVar7 = puVar9;
        }
        goto LAB_005bb845;
      }
      if (puVar7 < puVar13) {
        do {
          puVar13 = puVar12;
          if (puVar13 <= puVar7) break;
          puVar12 = puVar13 + -1;
        } while (*puVar13 == *puVar7);
      }
      if (puVar13 <= puVar7) {
        do {
          puVar13 = puVar13 + -1;
          if (puVar13 <= a) break;
        } while (*puVar13 == *puVar7);
      }
      if ((long)puVar13 - (long)a < (long)puVar4 - (long)puVar9) goto LAB_005bb96c;
      if (a < puVar13) {
        auStack_208[iVar2] = a;
        auStack_3f8[iVar2] = puVar13;
        uVar5 = (ulong)(iVar2 + 1);
      }
      iVar2 = (int)uVar5;
      a = puVar9;
      if (puVar4 <= puVar9) goto LAB_005bb98e;
    }
    for (; puVar9 = a, puVar7 = a, a < puVar4; puVar4 = puVar4 + -1) {
      while (puVar12 = puVar9, puVar7 = puVar7 + 1, puVar7 <= puVar4) {
        puVar9 = puVar7;
        if (*puVar7 <= *puVar12) {
          puVar9 = puVar12;
        }
      }
      uVar5 = *puVar12;
      *puVar12 = *puVar4;
      *puVar4 = uVar5;
    }
    goto LAB_005bb98e;
  }
  return;
LAB_005bb96c:
  if (puVar9 < puVar4) {
    auStack_208[iVar2] = puVar9;
    auStack_3f8[iVar2] = puVar4;
    uVar5 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar5;
  puVar4 = puVar13;
  if (puVar13 <= a) {
LAB_005bb98e:
    if (iVar2 < 1) {
      return;
    }
    uVar5 = (ulong)(iVar2 - 1);
    a = (ON__UINT64 *)auStack_208[uVar5];
    puVar4 = (ulong *)auStack_3f8[uVar5];
  }
  goto LAB_005bb7e8;
}

Assistant:

void ON_SortUINT64Array(
        ON::sort_algorithm sort_algorithm,
        ON__UINT64* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint64(a,nel);
  else
    ON_qsort_uint64(a,nel);
}